

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kmax_distance.cpp
# Opt level: O2

double __thiscall
ProbabEstimator::getProbabGtFast1
          (ProbabEstimator *this,double minValInRetained,int numReplaced,int pathLength)

{
  int i_1;
  long lVar1;
  int iVar2;
  ulong uVar3;
  int i;
  ulong uVar4;
  DistribFunction *this_00;
  double dVar5;
  double dVar6;
  double dVar7;
  double vals [20];
  double local_b8 [20];
  
  this_00 = this->distribFunction;
  uVar4 = (ulong)(uint)numReplaced;
  dVar5 = DistribFunction::getDistrib(this_00,minValInRetained);
  dVar7 = 1.0;
  local_b8[0] = 1.0;
  lVar1 = 0;
  iVar2 = pathLength;
  while (lVar1 <= numReplaced) {
    dVar6 = (double)iVar2;
    local_b8[lVar1] = dVar7;
    lVar1 = lVar1 + 1;
    iVar2 = iVar2 + -1;
    dVar7 = (dVar7 * dVar6) / (double)(int)lVar1;
  }
  dVar7 = 1.0 - dVar5;
  for (uVar3 = 0; (uint)(~(numReplaced >> 0x1f) & numReplaced) != uVar3; uVar3 = uVar3 + 1) {
    dVar6 = dVar7 * local_b8[uVar3 + 1];
    dVar7 = dVar7 * (1.0 - dVar5);
    local_b8[uVar3 + 1] = dVar6;
  }
  dVar7 = pown((ProbabEstimator *)this_00,dVar5,pathLength - numReplaced);
  for (; -1 < (int)uVar4; uVar4 = (ulong)((int)uVar4 - 1)) {
    dVar6 = dVar7 * local_b8[uVar4];
    dVar7 = dVar7 * dVar5;
    local_b8[uVar4] = dVar6;
  }
  dVar5 = 1.0;
  for (lVar1 = 0; lVar1 <= numReplaced; lVar1 = lVar1 + 1) {
    dVar5 = dVar5 - local_b8[lVar1];
  }
  return dVar5;
}

Assistant:

double ProbabEstimator::getProbabGtFast1( const double minValInRetained, const int numReplaced, const int pathLength ){

    double  PAr = distribFunction->getDistrib( minValInRetained );
    double cPAr = 1.0-PAr;
    double vals[20]; vals[0] = 1.0;

    double val = 1.0;
    for ( int i = 0; i <= numReplaced; ++i ){ vals[i] = val; val *= (double)(pathLength-i)/(double)(i+1); }
    val = cPAr; 
    for ( int i = 1; i <= numReplaced; ++i ){ vals[i] *= val; val *= cPAr; }
    val = pown( PAr, pathLength-numReplaced );
    for ( int i = numReplaced; i >= 0; --i ){ vals[i] *= val; val *= PAr; }
    val = 1.0;
    for ( int i = 0; i <= numReplaced; ++i ) val -= vals[i];
    return val;
}